

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.cpp
# Opt level: O0

void * de::detail::ArrayBuffer_AlignedMalloc(size_t numBytes,size_t alignment)

{
  int iVar1;
  bad_alloc *pbVar2;
  void *pvVar3;
  void *ptr;
  int sizeAsInt;
  size_t alignment_local;
  size_t numBytes_local;
  
  iVar1 = (int)numBytes;
  if ((-1 < iVar1) && (numBytes == (long)iVar1)) {
    pvVar3 = deAlignedMalloc((long)iVar1,(long)(int)alignment);
    if (pvVar3 == (void *)0x0) {
      pbVar2 = (bad_alloc *)__cxa_allocate_exception(8);
      std::bad_alloc::bad_alloc(pbVar2);
      __cxa_throw(pbVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    return pvVar3;
  }
  pbVar2 = (bad_alloc *)__cxa_allocate_exception(8);
  std::bad_alloc::bad_alloc(pbVar2);
  __cxa_throw(pbVar2,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
}

Assistant:

void* ArrayBuffer_AlignedMalloc (size_t numBytes, size_t alignment)
{
	const int	sizeAsInt	= (int)numBytes;
	void*		ptr;

	// int overflow
	if (sizeAsInt < 0 || numBytes != (size_t)sizeAsInt)
		throw std::bad_alloc();

	// alloc
	ptr = deAlignedMalloc(sizeAsInt, (int)alignment);
	if (!ptr)
		throw std::bad_alloc();

	// mark area as undefined for valgrind
#if defined(DE_VALGRIND_BUILD) && defined(HAVE_VALGRIND_MEMCHECK_H)
	if (RUNNING_ON_VALGRIND)
	{
		VALGRIND_MAKE_MEM_UNDEFINED(ptr, numBytes);
	}
#endif

	return ptr;
}